

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O3

Vec_Ptr_t * temporaryLtlStore(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  ulong uVar11;
  size_t __size;
  
  if (pNtk != (Abc_Ntk_t *)0x0) {
    pVVar9 = pNtk->vLtlProperties;
    uVar1 = pVVar9->nSize;
    if (0 < (int)uVar1) {
      pVVar5 = (Vec_Ptr_t *)malloc(0x10);
      uVar7 = 8;
      if (8 < uVar1) {
        uVar7 = (ulong)uVar1;
      }
      pVVar5->nSize = 0;
      pVVar5->nCap = (int)uVar7;
      ppvVar6 = (void **)malloc(uVar7 * 8);
      pVVar5->pArray = ppvVar6;
      __size = 0;
      uVar11 = 0;
      uVar4 = 0;
      do {
        uVar8 = uVar4;
        pvVar3 = pVVar9->pArray[uVar11];
        iVar10 = (int)uVar8;
        if ((int)uVar11 == (int)uVar7) {
          ppvVar6 = pVVar5->pArray;
          if (uVar11 < 0x10) {
            if (ppvVar6 == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(ppvVar6,0x80);
            }
            pVVar5->pArray = ppvVar6;
            uVar8 = 0x10;
          }
          else {
            if (ppvVar6 == (void **)0x0) {
              ppvVar6 = (void **)malloc(__size);
            }
            else {
              ppvVar6 = (void **)realloc(ppvVar6,__size);
            }
            pVVar5->pArray = ppvVar6;
          }
        }
        else {
          ppvVar6 = pVVar5->pArray;
          uVar8 = uVar7;
        }
        ppvVar6[uVar11] = pvVar3;
        uVar11 = uVar11 + 1;
        pVVar9 = pNtk->vLtlProperties;
        iVar2 = pVVar9->nSize;
        __size = __size + 0x10;
        uVar7 = uVar8;
        uVar4 = (ulong)(iVar10 + 2);
      } while ((long)uVar11 < (long)iVar2);
      pVVar5->nSize = (int)uVar11;
      pVVar5->nCap = (int)uVar8;
      if ((int)uVar11 == iVar2) {
        return pVVar5;
      }
      __assert_fail("Vec_PtrSize( tempStore ) == Vec_PtrSize( pNtk->vLtlProperties )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                    ,199,"Vec_Ptr_t *temporaryLtlStore(Abc_Ntk_t *)");
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *temporaryLtlStore( Abc_Ntk_t *pNtk )
{
    Vec_Ptr_t *tempStore;
    char *pFormula;
    int i;

    if( pNtk && Vec_PtrSize( pNtk->vLtlProperties ) > 0 )
    {
        tempStore = Vec_PtrAlloc( Vec_PtrSize( pNtk->vLtlProperties ) );
        Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pFormula, i )
            Vec_PtrPush( tempStore, pFormula );
        assert( Vec_PtrSize( tempStore ) == Vec_PtrSize( pNtk->vLtlProperties ) );
        return tempStore;
    }
    else
        return NULL;
}